

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::_update_activation(Group *this,GroupState *state,View *view)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  Controller *local_20;
  
  fVar1 = View::get_act(view);
  fVar2 = get_act_thr(this);
  dVar4 = update_act(this,view);
  fVar3 = get_act_thr(this);
  dVar5 = (double)fVar3;
  if ((state->was_c_active == true) && (state->was_c_salient == true)) {
    if ((state->is_c_active == true) && (state->is_c_salient != false)) {
      if (fVar1 <= fVar2) {
        if (dVar4 <= dVar5) {
          return;
        }
        goto LAB_001822ee;
      }
      if (dVar5 < dVar4) {
        return;
      }
    }
    (*((view->controller).object)->_vptr__Object[6])();
    return;
  }
  if (state->is_c_active != true) {
    return;
  }
  if (dVar4 <= dVar5) {
    return;
  }
  if (state->is_c_salient == false) {
    return;
  }
LAB_001822ee:
  (*((view->controller).object)->_vptr__Object[5])();
  local_20 = (Controller *)(view->controller).object;
  std::vector<r_exec::Controller*,std::allocator<r_exec::Controller*>>::
  emplace_back<r_exec::Controller*>
            ((vector<r_exec::Controller*,std::allocator<r_exec::Controller*>> *)
             &this->new_controllers,&local_20);
  return;
}

Assistant:

void Group::_update_activation(GroupState *state, View *view)
{
    bool view_was_active = view->get_act() > get_act_thr();
    bool view_is_active = update_act(view) > get_act_thr();

    // kill newly inactive controllers, register newly active ones.
    if (state->was_c_active && state->was_c_salient) {
        if (!state->is_c_active || !state->is_c_salient) { // group is not c-active and c-salient anymore: kill the view's controller.
            view->controller->lose_activation();
        } else { // group remains c-active and c-salient.
            if (!view_was_active) {
                if (view_is_active) { // register the controller for the newly active ipgm view.
                    view->controller->gain_activation();
                    new_controllers.push_back(view->controller);
                }
            } else {
                if (!view_is_active) { // kill the newly inactive ipgm view's overlays.
                    view->controller->lose_activation();
                }
            }
        }
    } else if (state->is_c_active && state->is_c_salient) { // group becomes c-active and c-salient.
        if (view_is_active) { // register the controller for any active ipgm view.
            view->controller->gain_activation();
            new_controllers.push_back(view->controller);
        }
    }
}